

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int IoTHubTransport_MQTT_GetSupportedPlatformInfo
              (TRANSPORT_LL_HANDLE handle,PLATFORM_INFO_OPTION *info)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  PLATFORM_INFO_OPTION *info_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if ((handle == (TRANSPORT_LL_HANDLE)0x0) || (info == (PLATFORM_INFO_OPTION *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_GetSupportedPlatformInfo",0x101d,1,
                "Invalid parameter specified (handle: %p, info: %p)",handle,info);
    }
    l._4_4_ = 0x101e;
  }
  else {
    *info = PLATFORM_INFO_OPTION_RETRIEVE_SQM;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int IoTHubTransport_MQTT_GetSupportedPlatformInfo(TRANSPORT_LL_HANDLE handle, PLATFORM_INFO_OPTION* info)
{
    int result;

    if (handle == NULL || info == NULL)
    {
        LogError("Invalid parameter specified (handle: %p, info: %p)", handle, info);
        result = MU_FAILURE;
    }
    else
    {
        *info = PLATFORM_INFO_OPTION_RETRIEVE_SQM;
        result = 0;
    }

    return result;
}